

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O3

void Ins_MIRP(TT_ExecContext exc,FT_Long *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  long lVar4;
  FT_Vector *pFVar5;
  FT_Vector *pFVar6;
  uint uVar7;
  undefined8 uVar8;
  byte bVar9;
  FT_Int32 FVar10;
  ulong uVar11;
  ulong uVar12;
  FT_F26Dot6 FVar13;
  ulong uVar14;
  ushort uVar15;
  FT_ULong in_RDX;
  long lVar16;
  FT_UShort FVar17;
  long lVar18;
  
  FVar17 = (FT_UShort)args;
  uVar7 = (uint)args;
  if ((((uVar7 & 0xffff) < (uint)(exc->zp1).n_points) && (in_RDX + 1 < exc->cvtSize + 1)) &&
     (uVar15 = (exc->GS).rp0, uVar15 < (exc->zp0).n_points)) {
    uVar3 = (exc->GS).minimum_distance;
    lVar4 = (exc->GS).control_value_cutin;
    if (in_RDX == 0xffffffffffffffff) {
      uVar11 = 0;
    }
    else {
      uVar11 = (*exc->func_read_cvt)(exc,in_RDX);
      uVar15 = (exc->GS).rp0;
    }
    uVar12 = (exc->GS).single_width_value;
    lVar18 = uVar11 - uVar12;
    lVar16 = -lVar18;
    if (0 < lVar18) {
      lVar16 = lVar18;
    }
    uVar14 = -uVar12;
    if (-1 < (long)uVar11) {
      uVar14 = uVar12;
    }
    if ((exc->GS).single_width_cutin <= lVar16) {
      uVar14 = uVar11;
    }
    if ((exc->GS).gep1 == 0) {
      pFVar5 = (exc->zp0).org;
      lVar16 = pFVar5[uVar15].x;
      FVar10 = TT_MulFix14_long_long((FT_Int32)uVar14,(int)(exc->GS).freeVector.x);
      pFVar6 = (exc->zp1).org;
      uVar11 = (ulong)((uVar7 & 0xffff) << 4);
      *(long *)((long)&pFVar6->x + uVar11) = FVar10 + lVar16;
      lVar16 = pFVar5[uVar15].y;
      FVar10 = TT_MulFix14_long_long((FT_Int32)uVar14,(int)(exc->GS).freeVector.y);
      *(long *)((long)&pFVar6->y + uVar11) = FVar10 + lVar16;
      puVar1 = (undefined8 *)((long)&pFVar6->x + uVar11);
      uVar8 = puVar1[1];
      puVar2 = (undefined8 *)((long)&((exc->zp1).cur)->x + uVar11);
      *puVar2 = *puVar1;
      puVar2[1] = uVar8;
      uVar15 = (exc->GS).rp0;
    }
    pFVar5 = (exc->zp0).org;
    pFVar6 = (exc->zp1).org;
    uVar11 = (ulong)((uVar7 & 0xffff) << 4);
    uVar12 = (*exc->func_dualproj)
                       (exc,*(long *)((long)&pFVar6->x + uVar11) - pFVar5[uVar15].x,
                        *(long *)((long)&pFVar6->y + uVar11) - pFVar5[uVar15].y);
    pFVar5 = (exc->zp0).cur;
    pFVar6 = (exc->zp1).cur;
    uVar15 = (exc->GS).rp0;
    FVar13 = (*exc->func_project)
                       (exc,*(long *)((long)&pFVar6->x + uVar11) - pFVar5[uVar15].x,
                        *(long *)((long)&pFVar6->y + uVar11) - pFVar5[uVar15].y);
    uVar11 = -uVar14;
    if (-1 < (long)(uVar12 ^ uVar14)) {
      uVar11 = uVar14;
    }
    if ((exc->GS).auto_flip == '\0') {
      uVar11 = uVar14;
    }
    bVar9 = exc->opcode;
    if ((bVar9 & 4) == 0) {
      lVar4 = (exc->tt_metrics).compensations[bVar9 & 3];
      if ((long)uVar11 < 0) {
        uVar11 = uVar11 - lVar4;
        uVar14 = (long)uVar11 >> 0x3f & uVar11;
      }
      else {
        uVar11 = lVar4 + uVar11;
        uVar14 = 0;
        if (0 < (long)uVar11) {
          uVar14 = uVar11;
        }
      }
    }
    else {
      if ((exc->GS).gep0 == (exc->GS).gep1) {
        lVar18 = uVar11 - uVar12;
        lVar16 = -lVar18;
        if (0 < lVar18) {
          lVar16 = lVar18;
        }
        if (lVar4 < lVar16) {
          uVar11 = uVar12;
        }
      }
      uVar14 = (*exc->func_round)(exc,uVar11,(exc->tt_metrics).compensations[bVar9 & 3]);
      bVar9 = exc->opcode;
    }
    if ((bVar9 & 8) != 0) {
      if ((long)uVar12 < 0) {
        if (SBORROW8(uVar14,-uVar3) == (long)(uVar14 + uVar3) < 0) {
          uVar14 = -uVar3;
        }
      }
      else if ((long)uVar14 <= (long)uVar3) {
        uVar14 = uVar3;
      }
    }
    (*exc->func_move)(exc,&exc->zp1,FVar17,uVar14 - FVar13);
  }
  else if (exc->pedantic_hinting != '\0') {
    exc->error = 0x86;
  }
  (exc->GS).rp1 = (exc->GS).rp0;
  if ((exc->opcode & 0x10) != 0) {
    (exc->GS).rp0 = FVar17;
  }
  (exc->GS).rp2 = FVar17;
  return;
}

Assistant:

static void
  Ins_MIRP( TT_ExecContext  exc,
            FT_Long*        args )
  {
    FT_UShort   point;
    FT_ULong    cvtEntry;

    FT_F26Dot6  cvt_dist,
                distance,
                cur_dist,
                org_dist,
                control_value_cutin,
                minimum_distance;
#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
    FT_Int      B1           = 0; /* pacify compiler */
    FT_Int      B2           = 0;
    FT_Bool     reverse_move = FALSE;
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */


    minimum_distance    = exc->GS.minimum_distance;
    control_value_cutin = exc->GS.control_value_cutin;
    point               = (FT_UShort)args[0];
    cvtEntry            = (FT_ULong)( args[1] + 1 );

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
    if ( SUBPIXEL_HINTING_INFINALITY                        &&
         exc->ignore_x_mode                                 &&
         exc->GS.freeVector.x != 0                          &&
         !( exc->sph_tweak_flags & SPH_TWEAK_NORMAL_ROUND ) )
      control_value_cutin = minimum_distance = 0;
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

    /* XXX: UNDOCUMENTED! cvt[-1] = 0 always */

    if ( BOUNDS( point,       exc->zp1.n_points ) ||
         BOUNDSL( cvtEntry,   exc->cvtSize + 1 )  ||
         BOUNDS( exc->GS.rp0, exc->zp0.n_points ) )
    {
      if ( exc->pedantic_hinting )
        exc->error = FT_THROW( Invalid_Reference );
      goto Fail;
    }

    if ( !cvtEntry )
      cvt_dist = 0;
    else
      cvt_dist = exc->func_read_cvt( exc, cvtEntry - 1 );

    /* single width test */

    if ( FT_ABS( cvt_dist - exc->GS.single_width_value ) <
         exc->GS.single_width_cutin )
    {
      if ( cvt_dist >= 0 )
        cvt_dist =  exc->GS.single_width_value;
      else
        cvt_dist = -exc->GS.single_width_value;
    }

    /* UNDOCUMENTED!  The MS rasterizer does that with */
    /* twilight points (confirmed by Greg Hitchcock)   */
    if ( exc->GS.gep1 == 0 )
    {
      exc->zp1.org[point].x = exc->zp0.org[exc->GS.rp0].x +
                              TT_MulFix14( cvt_dist,
                                           exc->GS.freeVector.x );
      exc->zp1.org[point].y = exc->zp0.org[exc->GS.rp0].y +
                              TT_MulFix14( cvt_dist,
                                           exc->GS.freeVector.y );
      exc->zp1.cur[point]   = exc->zp1.org[point];
    }

    org_dist = DUALPROJ( &exc->zp1.org[point], &exc->zp0.org[exc->GS.rp0] );
    cur_dist = PROJECT ( &exc->zp1.cur[point], &exc->zp0.cur[exc->GS.rp0] );

    /* auto-flip test */

    if ( exc->GS.auto_flip )
    {
      if ( ( org_dist ^ cvt_dist ) < 0 )
        cvt_dist = -cvt_dist;
    }

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
    if ( SUBPIXEL_HINTING_INFINALITY                               &&
         exc->ignore_x_mode                                        &&
         exc->GS.freeVector.y != 0                                 &&
         ( exc->sph_tweak_flags & SPH_TWEAK_TIMES_NEW_ROMAN_HACK ) )
    {
      if ( cur_dist < -64 )
        cvt_dist -= 16;
      else if ( cur_dist > 64 && cur_dist < 84 )
        cvt_dist += 32;
    }
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

    /* control value cut-in and round */

    if ( ( exc->opcode & 4 ) != 0 )
    {
      /* XXX: UNDOCUMENTED!  Only perform cut-in test when both points */
      /*      refer to the same zone.                                  */

      if ( exc->GS.gep0 == exc->GS.gep1 )
      {
        /* XXX: According to Greg Hitchcock, the following wording is */
        /*      the right one:                                        */
        /*                                                            */
        /*        When the absolute difference between the value in   */
        /*        the table [CVT] and the measurement directly from   */
        /*        the outline is _greater_ than the cut_in value, the */
        /*        outline measurement is used.                        */
        /*                                                            */
        /*      This is from `instgly.doc'.  The description in       */
        /*      `ttinst2.doc', version 1.66, is thus incorrect since  */
        /*      it implies `>=' instead of `>'.                       */

        if ( FT_ABS( cvt_dist - org_dist ) > control_value_cutin )
          cvt_dist = org_dist;
      }

      distance = exc->func_round(
                   exc,
                   cvt_dist,
                   exc->tt_metrics.compensations[exc->opcode & 3] );
    }
    else
    {

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
      /* do cvt cut-in always in MIRP for sph */
      if ( SUBPIXEL_HINTING_INFINALITY  &&
           exc->ignore_x_mode           &&
           exc->GS.gep0 == exc->GS.gep1 )
      {
        if ( FT_ABS( cvt_dist - org_dist ) > control_value_cutin )
          cvt_dist = org_dist;
      }
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

      distance = Round_None(
                   exc,
                   cvt_dist,
                   exc->tt_metrics.compensations[exc->opcode & 3] );
    }

    /* minimum distance test */

    if ( ( exc->opcode & 8 ) != 0 )
    {
      if ( org_dist >= 0 )
      {
        if ( distance < minimum_distance )
          distance = minimum_distance;
      }
      else
      {
        if ( distance > NEG_LONG( minimum_distance ) )
          distance = NEG_LONG( minimum_distance );
      }
    }

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
    if ( SUBPIXEL_HINTING_INFINALITY )
    {
      B1 = exc->zp1.cur[point].y;

      /* Round moves if necessary */
      if ( exc->ignore_x_mode                                          &&
           exc->GS.freeVector.y != 0                                   &&
           ( exc->sph_tweak_flags & SPH_TWEAK_ROUND_NONPIXEL_Y_MOVES ) )
        distance = FT_PIX_ROUND( B1 + distance - cur_dist ) - B1 + cur_dist;

      if ( exc->ignore_x_mode                                      &&
           exc->GS.freeVector.y != 0                               &&
           ( exc->opcode & 16 ) == 0                               &&
           ( exc->opcode & 8 ) == 0                                &&
           ( exc->sph_tweak_flags & SPH_TWEAK_COURIER_NEW_2_HACK ) )
        distance += 64;
    }
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

    exc->func_move( exc,
                    &exc->zp1,
                    point,
                    SUB_LONG( distance, cur_dist ) );

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
    if ( SUBPIXEL_HINTING_INFINALITY )
    {
      B2 = exc->zp1.cur[point].y;

      /* Reverse move if necessary */
      if ( exc->ignore_x_mode )
      {
        if ( exc->face->sph_compatibility_mode &&
             exc->GS.freeVector.y != 0         &&
             ( B1 & 63 ) == 0                  &&
             ( B2 & 63 ) != 0                  )
          reverse_move = TRUE;

        if ( ( exc->sph_tweak_flags & SPH_TWEAK_SKIP_NONPIXEL_Y_MOVES ) &&
             exc->GS.freeVector.y != 0                                  &&
             ( B2 & 63 ) != 0                                           &&
             ( B1 & 63 ) != 0                                           )
          reverse_move = TRUE;
      }

      if ( reverse_move )
        exc->func_move( exc,
                        &exc->zp1,
                        point,
                        SUB_LONG( cur_dist, distance ) );
    }

#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

  Fail:
    exc->GS.rp1 = exc->GS.rp0;

    if ( ( exc->opcode & 16 ) != 0 )
      exc->GS.rp0 = point;

    exc->GS.rp2 = point;
  }